

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O2

void __thiscall TCLAP::ValueArg<double>::_extractValue(ValueArg<double> *this,string *val)

{
  Constraint<double> *pCVar1;
  char cVar2;
  CmdLineParseException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ValueLike local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_88._vptr_ValueLike = (_func_int **)&PTR__ValueLike_00130bf0;
  ExtractValue<double>(&this->_value,val,&local_88);
  pCVar1 = this->_constraint;
  if (pCVar1 != (Constraint<double> *)0x0) {
    cVar2 = (**(code **)(*(long *)pCVar1 + 0x10))(pCVar1,&this->_value);
    if (cVar2 == '\0') {
      this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::operator+(&local_40,"Value \'",val);
      std::operator+(&bStack_c8,&local_40,"\' does not meet constraint: ");
      (*(code *)**(undefined8 **)this->_constraint)(&local_60);
      std::operator+(&local_a8,&bStack_c8,&local_60);
      (*(this->super_Arg)._vptr_Arg[7])(&local_80,this);
      CmdLineParseException::CmdLineParseException(this_00,&local_a8,&local_80);
      __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
    }
  }
  return;
}

Assistant:

void ValueArg<T>::_extractValue( const std::string& val ) 
{
    try {
	ExtractValue(_value, val, typename ArgTraits<T>::ValueCategory());
    } catch( ArgParseException &e) {
	throw ArgParseException(e.error(), toString());
    }
    
    if ( _constraint != NULL )
	if ( ! _constraint->check( _value ) )
	    throw( CmdLineParseException( "Value '" + val + 
					  + "' does not meet constraint: " 
					  + _constraint->description(),
					  toString() ) );
}